

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O0

void __thiscall
onmt::SubwordLearner::SubwordLearner(SubwordLearner *this,bool verbose,Tokenizer *default_tokenizer)

{
  long in_RDX;
  byte in_SIL;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  allocator<char> *in_stack_ffffffffffffff50;
  allocator<char> local_81;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  uint3 in_stack_ffffffffffffffa0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  Mode in_stack_ffffffffffffffac;
  undefined6 in_stack_ffffffffffffffb0;
  byte bVar2;
  allocator<char> in_stack_ffffffffffffffb7;
  string local_48 [8];
  int in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR__SubwordLearner_006efce0;
  *(byte *)(in_RDI + 1) = in_SIL & 1;
  bVar2 = 0;
  uVar1 = (uint)in_stack_ffffffffffffffa0;
  if (in_RDX == 0) {
    operator_new(0xc0);
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    uVar1 = CONCAT13(1,(int3)uVar1);
    in_stack_ffffffffffffff50 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff48 = 0x32;
    Tokenizer::Tokenizer
              ((Tokenizer *)
               CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(bVar2,in_stack_ffffffffffffffb0)),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
               (string *)CONCAT44(in_stack_ffffffffffffffa4,uVar1),in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffffc0);
  }
  std::shared_ptr<onmt::Tokenizer_const>::shared_ptr<onmt::Tokenizer_const,void>
            ((shared_ptr<const_onmt::Tokenizer> *)in_stack_ffffffffffffff50,
             (Tokenizer *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (in_RDX == 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator(&local_81);
  }
  if ((uVar1 & 0x1000000) != 0) {
    std::__cxx11::string::~string(local_48);
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  }
  return;
}

Assistant:

SubwordLearner::SubwordLearner(bool verbose, const Tokenizer* default_tokenizer)
    : _verbose(verbose)
    , _default_tokenizer(default_tokenizer
                         ? default_tokenizer
                         : new Tokenizer(Tokenizer::Mode::None, Tokenizer::Flags::NoSubstitution))
  {
  }